

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_codestream_info_v2_t * j2k_get_cstr_info(opj_j2k_t *p_j2k)

{
  opj_tccp_t *poVar1;
  OPJ_UINT32 OVar2;
  opj_tcp_t *poVar3;
  opj_tccp_t *poVar4;
  undefined8 uVar5;
  opj_tccp_info_t *poVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  OPJ_PROG_ORDER OVar9;
  uint uVar10;
  ulong uVar11;
  opj_codestream_info_v2_t *poVar12;
  opj_tccp_info_t *poVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  opj_codestream_info_v2_t *cstr_info;
  opj_codestream_info_v2_t *local_38;
  
  uVar11 = (ulong)p_j2k->m_private_image->numcomps;
  poVar12 = (opj_codestream_info_v2_t *)opj_calloc(1,0x48);
  if (poVar12 != (opj_codestream_info_v2_t *)0x0) {
    uVar10 = p_j2k->m_private_image->numcomps;
    poVar12->nbcomps = uVar10;
    OVar2 = (p_j2k->m_cp).ty0;
    OVar7 = (p_j2k->m_cp).tdx;
    OVar8 = (p_j2k->m_cp).tdy;
    poVar12->tx0 = (p_j2k->m_cp).tx0;
    poVar12->ty0 = OVar2;
    poVar12->tdx = OVar7;
    poVar12->tdy = OVar8;
    OVar2 = (p_j2k->m_cp).th;
    poVar12->tw = (p_j2k->m_cp).tw;
    poVar12->th = OVar2;
    poVar12->tile_info = (opj_tile_info_v2_t *)0x0;
    poVar3 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    OVar9 = poVar3->prg;
    (poVar12->m_default_tile_info).csty = poVar3->csty;
    (poVar12->m_default_tile_info).prg = OVar9;
    (poVar12->m_default_tile_info).numlayers = poVar3->numlayers;
    (poVar12->m_default_tile_info).mct = poVar3->mct;
    local_38 = poVar12;
    poVar13 = (opj_tccp_info_t *)opj_calloc((ulong)uVar10,0x438);
    (poVar12->m_default_tile_info).tccp_info = poVar13;
    if (poVar13 != (opj_tccp_info_t *)0x0) {
      if (uVar11 == 0) {
        return poVar12;
      }
      lVar16 = 0x1a4;
      lVar17 = 0x20;
      uVar15 = 0;
      do {
        poVar4 = poVar3->tccps;
        poVar13 = (poVar12->m_default_tile_info).tccp_info;
        poVar1 = poVar4 + uVar15;
        OVar2 = poVar1->numresolutions;
        uVar5 = *(undefined8 *)&poVar1->cblkw;
        uVar10 = poVar4[uVar15].numresolutions;
        poVar6 = poVar13 + uVar15;
        poVar6->csty = poVar1->csty;
        poVar6->numresolutions = OVar2;
        *(undefined8 *)(&poVar6->csty + 2) = uVar5;
        OVar2 = poVar4[uVar15].qmfbid;
        poVar13[uVar15].cblksty = poVar4[uVar15].cblksty;
        poVar13[uVar15].qmfbid = OVar2;
        if (uVar10 < 0x21) {
          memcpy(poVar13[uVar15].prch,poVar4[uVar15].prch,(ulong)uVar10);
          memcpy(poVar13[uVar15].prcw,poVar4[uVar15].prcw,(ulong)poVar4[uVar15].numresolutions);
        }
        OVar2 = poVar4[uVar15].qntsty;
        poVar13[uVar15].qntsty = OVar2;
        poVar13[uVar15].numgbits = poVar4[uVar15].numgbits;
        uVar10 = 1;
        if (OVar2 == 1) {
LAB_001129ff:
          uVar14 = 0;
          do {
            *(undefined4 *)((long)poVar13 + uVar14 * 4 + lVar16 + -0x184) =
                 *(undefined4 *)((long)poVar4->stepsizes + uVar14 * 8 + lVar17 + -0x1c);
            *(undefined4 *)((long)poVar13->stepsizes_mant + uVar14 * 4 + lVar16 + -0x20) =
                 *(undefined4 *)((long)&poVar4->stepsizes[uVar14 - 4].expn + lVar17);
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
        }
        else if (poVar4[uVar15].numresolutions * 3 - 3 < 0x60) {
          uVar10 = poVar4[uVar15].numresolutions * 3 - 2;
          goto LAB_001129ff;
        }
        poVar13[uVar15].roishift = poVar4[uVar15].roishift;
        uVar15 = uVar15 + 1;
        lVar16 = lVar16 + 0x438;
        lVar17 = lVar17 + 0x438;
        if (uVar15 == uVar11) {
          return poVar12;
        }
      } while( true );
    }
    opj_destroy_cstr_info(&local_38);
  }
  return (opj_codestream_info_v2_t *)0x0;
}

Assistant:

opj_codestream_info_v2_t* j2k_get_cstr_info(opj_j2k_t* p_j2k)
{
    OPJ_UINT32 compno;
    OPJ_UINT32 numcomps = p_j2k->m_private_image->numcomps;
    opj_tcp_t *l_default_tile;
    opj_codestream_info_v2_t* cstr_info = (opj_codestream_info_v2_t*) opj_calloc(1,
                                          sizeof(opj_codestream_info_v2_t));
    if (!cstr_info) {
        return NULL;
    }

    cstr_info->nbcomps = p_j2k->m_private_image->numcomps;

    cstr_info->tx0 = p_j2k->m_cp.tx0;
    cstr_info->ty0 = p_j2k->m_cp.ty0;
    cstr_info->tdx = p_j2k->m_cp.tdx;
    cstr_info->tdy = p_j2k->m_cp.tdy;
    cstr_info->tw = p_j2k->m_cp.tw;
    cstr_info->th = p_j2k->m_cp.th;

    cstr_info->tile_info = NULL; /* Not fill from the main header*/

    l_default_tile = p_j2k->m_specific_param.m_decoder.m_default_tcp;

    cstr_info->m_default_tile_info.csty = l_default_tile->csty;
    cstr_info->m_default_tile_info.prg = l_default_tile->prg;
    cstr_info->m_default_tile_info.numlayers = l_default_tile->numlayers;
    cstr_info->m_default_tile_info.mct = l_default_tile->mct;

    cstr_info->m_default_tile_info.tccp_info = (opj_tccp_info_t*) opj_calloc(
                cstr_info->nbcomps, sizeof(opj_tccp_info_t));
    if (!cstr_info->m_default_tile_info.tccp_info) {
        opj_destroy_cstr_info(&cstr_info);
        return NULL;
    }

    for (compno = 0; compno < numcomps; compno++) {
        opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
        opj_tccp_info_t *l_tccp_info = &
                                       (cstr_info->m_default_tile_info.tccp_info[compno]);
        OPJ_INT32 bandno, numbands;

        /* coding style*/
        l_tccp_info->csty = l_tccp->csty;
        l_tccp_info->numresolutions = l_tccp->numresolutions;
        l_tccp_info->cblkw = l_tccp->cblkw;
        l_tccp_info->cblkh = l_tccp->cblkh;
        l_tccp_info->cblksty = l_tccp->cblksty;
        l_tccp_info->qmfbid = l_tccp->qmfbid;
        if (l_tccp->numresolutions < OPJ_J2K_MAXRLVLS) {
            memcpy(l_tccp_info->prch, l_tccp->prch, l_tccp->numresolutions);
            memcpy(l_tccp_info->prcw, l_tccp->prcw, l_tccp->numresolutions);
        }

        /* quantization style*/
        l_tccp_info->qntsty = l_tccp->qntsty;
        l_tccp_info->numgbits = l_tccp->numgbits;

        numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 :
                   (OPJ_INT32)l_tccp->numresolutions * 3 - 2;
        if (numbands < OPJ_J2K_MAXBANDS) {
            for (bandno = 0; bandno < numbands; bandno++) {
                l_tccp_info->stepsizes_mant[bandno] = (OPJ_UINT32)
                                                      l_tccp->stepsizes[bandno].mant;
                l_tccp_info->stepsizes_expn[bandno] = (OPJ_UINT32)
                                                      l_tccp->stepsizes[bandno].expn;
            }
        }

        /* RGN value*/
        l_tccp_info->roishift = l_tccp->roishift;
    }

    return cstr_info;
}